

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O0

bool libtorrent::aux::has_bits(uint8_t *k,uint8_t *bits,int len)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  bool local_25;
  uint32_t idx2;
  uint32_t idx1;
  int len_local;
  uint8_t *bits_local;
  uint8_t *k_local;
  
  uVar1 = *(ushort *)k;
  uVar2 = *(ushort *)(k + 2);
  uVar3 = numeric_cast<unsigned_int,int,void>(len << 3);
  uVar4 = numeric_cast<unsigned_int,int,void>(len << 3);
  local_25 = false;
  if (((uint)bits[(uint)uVar1 % uVar3 >> 3] & 1 << ((byte)((uint)uVar1 % uVar3) & 7)) != 0) {
    local_25 = ((uint)bits[(uint)uVar2 % uVar4 >> 3] & 1 << ((byte)((uint)uVar2 % uVar4) & 7)) != 0;
  }
  return local_25;
}

Assistant:

bool has_bits(std::uint8_t const* k, std::uint8_t const* bits, int const len)
	{
		std::uint32_t idx1 = std::uint32_t(k[0]) | (std::uint32_t(k[1]) << 8);
		std::uint32_t idx2 = std::uint32_t(k[2]) | (std::uint32_t(k[3]) << 8);
		idx1 %= aux::numeric_cast<std::uint32_t>(len * 8);
		idx2 %= aux::numeric_cast<std::uint32_t>(len * 8);
		return (bits[idx1 / 8] & (1 << (idx1 & 7))) != 0
			&& (bits[idx2 / 8] & (1 << (idx2 & 7))) != 0;
	}